

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_extensions.cpp
# Opt level: O0

bool __thiscall extensions::ExitedOrKilled::operator()(ExitedOrKilled *this,int value)

{
  bool bVar1;
  bool local_15;
  int value_local;
  ExitedOrKilled *this_local;
  
  bVar1 = testing::ExitedWithCode::operator()(&this->_exitedWithCode,value);
  local_15 = true;
  if (!bVar1) {
    local_15 = testing::KilledBySignal::operator()(&this->_killedBySignal,value);
  }
  return local_15;
}

Assistant:

bool ExitedOrKilled::operator()(int value) const {
        return _exitedWithCode(value) ||
#ifndef _WIN32
            _killedBySignal(value);
#else
        false;
#endif
    }